

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agg_vertex_sequence.h
# Opt level: O0

void __thiscall
agg::vertex_sequence<agg::vertex_dist,_6U>::add
          (vertex_sequence<agg::vertex_dist,_6U> *this,vertex_dist *val)

{
  bool bVar1;
  uint uVar2;
  vertex_dist *this_00;
  vertex_dist *val_00;
  vertex_dist *val_local;
  vertex_sequence<agg::vertex_dist,_6U> *this_local;
  
  uVar2 = pod_bvector<agg::vertex_dist,_6U>::size(&this->super_pod_bvector<agg::vertex_dist,_6U>);
  if (1 < uVar2) {
    uVar2 = pod_bvector<agg::vertex_dist,_6U>::size(&this->super_pod_bvector<agg::vertex_dist,_6U>);
    this_00 = pod_bvector<agg::vertex_dist,_6U>::operator[]
                        (&this->super_pod_bvector<agg::vertex_dist,_6U>,uVar2 - 2);
    uVar2 = pod_bvector<agg::vertex_dist,_6U>::size(&this->super_pod_bvector<agg::vertex_dist,_6U>);
    val_00 = pod_bvector<agg::vertex_dist,_6U>::operator[]
                       (&this->super_pod_bvector<agg::vertex_dist,_6U>,uVar2 - 1);
    bVar1 = vertex_dist::operator()(this_00,val_00);
    if (!bVar1) {
      pod_bvector<agg::vertex_dist,_6U>::remove_last(&this->super_pod_bvector<agg::vertex_dist,_6U>)
      ;
    }
  }
  pod_bvector<agg::vertex_dist,_6U>::add(&this->super_pod_bvector<agg::vertex_dist,_6U>,val);
  return;
}

Assistant:

void vertex_sequence<T, S>::add(const T& val)
    {
        if(base_type::size() > 1)
        {
            if(!(*this)[base_type::size() - 2]((*this)[base_type::size() - 1])) 
            {
                base_type::remove_last();
            }
        }
        base_type::add(val);
    }